

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool __thiscall
cfd::core::Pubkey::VerifyBitcoinMessage
          (Pubkey *this,ByteData *signature,string *message,Pubkey *pubkey)

{
  bool bVar1;
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,"Bitcoin Signed Message:\n",&local_49);
  bVar1 = VerifyMessage(this,signature,message,&local_48,pubkey);
  ::std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool Pubkey::VerifyBitcoinMessage(
    const ByteData &signature, const std::string &message,
    Pubkey *pubkey) const {
  return VerifyMessage(
      signature, message, std::string(kBitcoinMessageMagic), pubkey);
}